

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::NearestNeighborsIndex::ByteSizeLong(NearestNeighborsIndex *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Type *this_00;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  uint index;
  
  uVar1 = (this->floatsamples_).super_RepeatedPtrFieldBase.current_size_;
  uVar6 = (ulong)uVar1;
  index = 0;
  if (uVar6 == 0) {
    uVar6 = 0;
  }
  else {
    do {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                          (&(this->floatsamples_).super_RepeatedPtrFieldBase,index);
      sVar4 = FloatVector::ByteSizeLong(this_00);
      uVar3 = (uint)sVar4 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar6 = uVar6 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar1 != index);
  }
  uVar1 = this->numberofdimensions_;
  if (uVar1 != 0) {
    if ((int)uVar1 < 0) {
      uVar5 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar1 | 1) != 0) {
        for (; (uVar1 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar5 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    uVar6 = uVar6 + uVar5;
  }
  if (this->_oneof_case_[0] == 0x6e) {
    uVar1 = ((this->IndexType_).singlekdtreeindex_)->leafsize_;
    if (uVar1 == 0) {
      uVar5 = 0;
    }
    else if ((int)uVar1 < 0) {
      uVar5 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar1 | 1) != 0) {
        for (; (uVar1 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar5 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    ((this->IndexType_).singlekdtreeindex_)->_cached_size_ = (int)uVar5;
    uVar6 = uVar6 + uVar5 + 3;
  }
  else if (this->_oneof_case_[0] == 100) {
    ((this->IndexType_).linearindex_)->_cached_size_ = 0;
    uVar6 = uVar6 + 3;
  }
  if (this->_oneof_case_[1] == 200) {
    ((this->DistanceFunction_).squaredeuclideandistance_)->_cached_size_ = 0;
    uVar6 = uVar6 + 3;
  }
  this->_cached_size_ = (int)uVar6;
  return uVar6;
}

Assistant:

size_t NearestNeighborsIndex::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NearestNeighborsIndex)
  size_t total_size = 0;

  // repeated .CoreML.Specification.FloatVector floatSamples = 2;
  {
    unsigned int count = this->floatsamples_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->floatsamples(i));
    }
  }

  // int32 numberOfDimensions = 1;
  if (this->numberofdimensions() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->numberofdimensions());
  }

  switch (IndexType_case()) {
    // .CoreML.Specification.LinearIndex linearIndex = 100;
    case kLinearIndex: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *IndexType_.linearindex_);
      break;
    }
    // .CoreML.Specification.SingleKdTreeIndex singleKdTreeIndex = 110;
    case kSingleKdTreeIndex: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *IndexType_.singlekdtreeindex_);
      break;
    }
    case INDEXTYPE_NOT_SET: {
      break;
    }
  }
  switch (DistanceFunction_case()) {
    // .CoreML.Specification.SquaredEuclideanDistance squaredEuclideanDistance = 200;
    case kSquaredEuclideanDistance: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *DistanceFunction_.squaredeuclideandistance_);
      break;
    }
    case DISTANCEFUNCTION_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}